

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIR.cpp
# Opt level: O2

double __thiscall FIR::getCoeff(FIR *this,int i)

{
  if ((-1 < i) && (i < this->taps)) {
    return (double)(this->coeff).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[(uint)i];
  }
  puts("\nThat coefficient does not exist");
  return 0.0;
}

Assistant:

double FIR::getCoeff (int i){
	if (i>= this->getTaps() or i<0) {
	printf("\nThat coefficient does not exist\n");
	return 0.0;
	}else{
	return coeff[i];
	}
}